

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::UniformLocImplicitInSomeStages3::Run(UniformLocImplicitInSomeStages3 *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  Loc _location;
  Loc _location_00;
  Loc _location_01;
  Loc _location_02;
  Loc _location_03;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  Uniform local_548;
  UniformType local_370;
  UniformType local_2e0;
  UniformType local_250;
  UniformType local_1c0;
  UniformType local_130;
  UniformType local_a0;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_a0,0x1406,0);
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  _location.super_LayoutSpecifierBase.occurence.occurence = FSH_OR_CSH;
  _location.super_LayoutSpecifierBase.val = 3;
  _location.super_LayoutSpecifierBase.numSys = Dec;
  anon_unknown_0::Uniform::Uniform
            (&local_548,generator,&local_a0,_location,(DefOccurence)0x0,(DefOccurence)0x3);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_548);
  anon_unknown_0::Uniform::~Uniform(&local_548);
  UniformType::~UniformType(&local_a0);
  UniformType::UniformType(&local_130,0x1406,0);
  _location_00.super_LayoutSpecifierBase.occurence.occurence = ALL_BUT_FSH;
  _location_00.super_LayoutSpecifierBase.val = 2;
  _location_00.super_LayoutSpecifierBase.numSys = Dec;
  anon_unknown_0::Uniform::Uniform
            (&local_548,generator,&local_130,_location_00,(DefOccurence)0x0,(DefOccurence)0x2);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_548);
  anon_unknown_0::Uniform::~Uniform(&local_548);
  UniformType::~UniformType(&local_130);
  UniformType::UniformType(&local_1c0,0x1406,3);
  _location_01.super_LayoutSpecifierBase.occurence.occurence = FSH_OR_CSH;
  _location_01.super_LayoutSpecifierBase.val = 7;
  _location_01.super_LayoutSpecifierBase.numSys = Dec;
  anon_unknown_0::Uniform::Uniform
            (&local_548,generator,&local_1c0,_location_01,(DefOccurence)0x0,(DefOccurence)0x3);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_548);
  anon_unknown_0::Uniform::~Uniform(&local_548);
  UniformType::~UniformType(&local_1c0);
  UniformType::UniformType(&local_250,0x1406,3);
  _location_02.super_LayoutSpecifierBase.occurence.occurence = ALL_BUT_FSH;
  _location_02.super_LayoutSpecifierBase.val = 4;
  _location_02.super_LayoutSpecifierBase.numSys = Dec;
  anon_unknown_0::Uniform::Uniform
            (&local_548,generator,&local_250,_location_02,(DefOccurence)0x0,(DefOccurence)0x2);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_548);
  anon_unknown_0::Uniform::~Uniform(&local_548);
  UniformType::~UniformType(&local_250);
  UniformType::UniformType(&local_2e0,0x1406,0);
  anon_unknown_0::Uniform::Uniform
            (&local_548,generator,&local_2e0,(Loc)(ZEXT412(1) << 0x40),(DefOccurence)0x0,
             (DefOccurence)0x4);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_548);
  anon_unknown_0::Uniform::~Uniform(&local_548);
  UniformType::~UniformType(&local_2e0);
  UniformType::UniformType(&local_370,0x1406,0);
  _location_03.super_LayoutSpecifierBase.occurence.occurence = ALL_BUT_FSH;
  _location_03.super_LayoutSpecifierBase.val = 1;
  _location_03.super_LayoutSpecifierBase.numSys = Dec;
  anon_unknown_0::Uniform::Uniform
            (&local_548,generator,&local_370,_location_03,(DefOccurence)0x0,(DefOccurence)0x4);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_548);
  anon_unknown_0::Uniform::~Uniform(&local_548);
  UniformType::~UniformType(&local_370);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&uniforms);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&uniforms);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		std::vector<Uniform> uniforms;

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(3, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));

		//location in all but fsh, declaration in all shaders, usage in fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(2, DefOccurence::ALL_BUT_FSH),
								   DefOccurence::ALL_SH, DefOccurence::FSH_OR_CSH));

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3), Loc::C(7, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));

		//location in all but fsh, declaration in all shaders, usage in fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3),
								   Loc::C(4, DefOccurence::ALL_BUT_FSH), DefOccurence::ALL_SH,
								   DefOccurence::FSH_OR_CSH));

		//location only in vsh, declaration in all shaders, usage in all shaders but vsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(0, DefOccurence::VSH), DefOccurence::ALL_SH,
								   DefOccurence::ALL_BUT_VSH));

		//location only in vsh, declaration in all shaders, usage in all shaders but vsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(1, DefOccurence::ALL_BUT_FSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_VSH));

		return doRun(uniforms);
	}